

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

char * make_GLSL_srcarg_string(Context *ctx,size_t idx,int writemask,char *buf,size_t buflen)

{
  RegisterType RVar1;
  uint uVar2;
  uint uVar3;
  MOJOSHADER_shaderType shader_type;
  uint uVar4;
  VariableList *pVVar5;
  undefined1 auVar6 [4];
  int iVar7;
  char *pcVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  char *__s;
  char *pcVar12;
  char *__s_00;
  char local_d8 [64];
  char acStack_98 [8];
  char rel_offset [32];
  char swiz_str [6];
  char *local_58;
  undefined1 local_4c [4];
  char *pcStack_48;
  char rel_swizzle [4];
  char *local_40;
  
  pcVar11 = acStack_98;
  __s = acStack_98;
  *buf = '\0';
  switch(ctx->source_args[idx].src_mod) {
  case SRCMOD_NEGATE:
    local_40 = "-";
    goto LAB_0011d45b;
  case SRCMOD_BIAS:
    local_40 = "(";
    goto LAB_0011d4b0;
  case SRCMOD_BIASNEGATE:
    local_40 = "-(";
LAB_0011d4b0:
    pcStack_48 = " - 0.5)";
    goto LAB_0011d506;
  case SRCMOD_SIGN:
    local_40 = "((";
    goto LAB_0011d48d;
  case SRCMOD_SIGNNEGATE:
    local_40 = "-((";
LAB_0011d48d:
    pcStack_48 = " - 0.5) * 2.0)";
    goto LAB_0011d506;
  case SRCMOD_COMPLEMENT:
    local_40 = "(1.0 - ";
    break;
  case SRCMOD_X2:
    local_40 = "(";
    goto LAB_0011d4e0;
  case SRCMOD_X2NEGATE:
    local_40 = "-(";
LAB_0011d4e0:
    pcStack_48 = " * 2.0)";
    goto LAB_0011d506;
  case SRCMOD_DZ:
    pcVar12 = "SRCMOD_DZ unsupported";
    goto LAB_0011d7b3;
  case SRCMOD_DW:
    pcVar12 = "SRCMOD_DW unsupported";
    pcVar11 = acStack_98;
    goto LAB_0011d7b3;
  case SRCMOD_ABS:
    local_40 = "abs(";
    break;
  case SRCMOD_ABSNEGATE:
    local_40 = "-abs(";
    break;
  case SRCMOD_NOT:
    local_40 = "!";
LAB_0011d45b:
    pcStack_48 = "";
    goto LAB_0011d506;
  default:
    pcStack_48 = "";
    local_40 = "";
    goto LAB_0011d506;
  }
  pcStack_48 = ")";
LAB_0011d506:
  if (ctx->source_args[idx].relative == 0) {
    __s = local_d8;
    buflen = (size_t)get_D3D_register_string
                               (ctx,ctx->source_args[idx].regtype,ctx->source_args[idx].regnum,
                                acStack_98,buflen);
    snprintf(__s,0x40,"%s_%s%s",ctx->shader_type_str,buflen,acStack_98);
    pcVar11 = __s;
  }
  else {
    pcVar11 = (char *)0x0;
  }
  rel_offset[8] = '\0';
  rel_offset[9] = '\0';
  rel_offset[10] = '\0';
  rel_offset[0xb] = '\0';
  rel_offset[0xc] = '\0';
  rel_offset[0xd] = '\0';
  rel_offset[0xe] = '\0';
  rel_offset[0xf] = '\0';
  rel_offset[0x10] = '\0';
  rel_offset[0x11] = '\0';
  rel_offset[0x12] = '\0';
  rel_offset[0x13] = '\0';
  rel_offset[0x14] = '\0';
  rel_offset[0x15] = '\0';
  rel_offset[0x16] = '\0';
  rel_offset[0x17] = '\0';
  acStack_98[0] = '\0';
  acStack_98[1] = '\0';
  acStack_98[2] = '\0';
  acStack_98[3] = '\0';
  acStack_98[4] = '\0';
  acStack_98[5] = '\0';
  acStack_98[6] = '\0';
  acStack_98[7] = '\0';
  rel_offset[0] = '\0';
  rel_offset[1] = '\0';
  rel_offset[2] = '\0';
  rel_offset[3] = '\0';
  rel_offset[4] = '\0';
  rel_offset[5] = '\0';
  rel_offset[6] = '\0';
  rel_offset[7] = '\0';
  local_4c = (undefined1  [4])0x0;
  if (ctx->source_args[idx].relative == 0) {
    pcVar12 = "";
    local_58 = "";
    __s_00 = "";
  }
  else {
    RVar1 = ctx->source_args[idx].regtype;
    if (RVar1 == REG_TYPE_CONST) {
      pVVar5 = ctx->source_args[idx].relative_array;
      uVar2 = pVVar5->index;
      uVar4 = ctx->source_args[idx].regnum;
      uVar9 = uVar4 - uVar2;
      if ((int)uVar9 < 0) {
        *(code **)(__s + -8) = make_GLSL_swizzle_string;
        __assert_fail("offset >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x823,
                      "const char *make_GLSL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                     );
      }
      if (pVVar5->constant == (ConstantsList *)0x0) {
        pcVar11 = ctx->shader_type_str;
        buflen = 0x13c3e9;
        __s[-0x48] = '`';
        __s[-0x47] = -0x2a;
        __s[-0x46] = '\x11';
        __s[-0x45] = '\0';
        __s[-0x44] = '\0';
        __s[-0x43] = '\0';
        __s[-0x42] = '\0';
        __s[-0x41] = '\0';
        snprintf(__s + -0x40,0x40,"%s_uniforms_%s",pcVar11);
        if (uVar4 == uVar2) {
          pcVar11 = "ARRAYBASE_%d + ";
          goto LAB_0011d67b;
        }
        buflen = (size_t)uVar9;
        __s[-0x48] = -0x48;
        __s[-0x47] = -0x2a;
        __s[-0x46] = '\x11';
        __s[-0x45] = '\0';
        __s[-0x44] = '\0';
        __s[-0x43] = '\0';
        __s[-0x42] = '\0';
        __s[-0x41] = '\0';
        snprintf(acStack_98,0x20,"(ARRAYBASE_%d + %d) + ",(ulong)uVar2);
      }
      else {
        uVar3 = pVVar5->count;
        pcVar11 = ctx->shader_type_str;
        buflen = (size_t)uVar2;
        __s[-0x48] = '\x11';
        __s[-0x47] = -0x2a;
        __s[-0x46] = '\x11';
        __s[-0x45] = '\0';
        __s[-0x44] = '\0';
        __s[-0x43] = '\0';
        __s[-0x42] = '\0';
        __s[-0x41] = '\0';
        snprintf(__s + -0x40,0x40,"%s_const_array_%d_%d",pcVar11,buflen,(ulong)uVar3);
        if (uVar4 != uVar2) {
          pcVar11 = "%d + ";
          uVar2 = uVar9;
LAB_0011d67b:
          __s[-0x48] = -0x7e;
          __s[-0x47] = -0x2a;
          __s[-0x46] = '\x11';
          __s[-0x45] = '\0';
          __s[-0x44] = '\0';
          __s[-0x43] = '\0';
          __s[-0x42] = '\0';
          __s[-0x41] = '\0';
          snprintf(acStack_98,0x20,pcVar11,(ulong)uVar2);
        }
      }
    }
    else {
      if (RVar1 != REG_TYPE_INPUT) {
        __s[-8] = -0xe;
        __s[-7] = -0x29;
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        __assert_fail("arg->regtype == REG_TYPE_CONST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x820,
                      "const char *make_GLSL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                     );
      }
      builtin_strncpy(__s + -0x40,"vertex_input_array",0x13);
    }
    pcVar11 = __s + -0x40;
    RVar1 = ctx->source_args[idx].relative_regtype;
    iVar10 = ctx->source_args[idx].relative_regnum;
    __s_00 = __s + -0x80;
    __s[-0x88] = -0x29;
    __s[-0x87] = -0x2a;
    __s[-0x86] = '\x11';
    __s[-0x85] = '\0';
    __s[-0x84] = '\0';
    __s[-0x83] = '\0';
    __s[-0x82] = '\0';
    __s[-0x81] = '\0';
    pcVar8 = get_D3D_register_string(ctx,RVar1,iVar10,rel_offset + 0x18,buflen);
    pcVar12 = ctx->shader_type_str;
    __s[-0x88] = -6;
    __s[-0x87] = -0x2a;
    __s[-0x86] = '\x11';
    __s[-0x85] = '\0';
    __s[-0x84] = '\0';
    __s[-0x83] = '\0';
    __s[-0x82] = '\0';
    __s[-0x81] = '\0';
    snprintf(__s_00,0x40,"%s_%s%s",pcVar12,pcVar8,rel_offset + 0x18);
    auVar6 = local_4c;
    local_4c[1] = "xyzw"[ctx->source_args[idx].relative_component];
    local_4c[0] = 0x2e;
    local_4c[3] = auVar6[3];
    local_4c[2] = 0;
    local_58 = "]";
    pcVar12 = "[";
    __s = __s_00;
  }
  rel_offset[0x1c] = '\0';
  rel_offset[0x1d] = '\0';
  rel_offset[0x18] = '\0';
  rel_offset[0x19] = '\0';
  rel_offset[0x1a] = '\0';
  rel_offset[0x1b] = '\0';
  shader_type = ctx->shader_type;
  iVar10 = ctx->source_args[idx].regnum;
  RVar1 = ctx->source_args[idx].regtype;
  __s[-8] = 'G';
  __s[-7] = -0x29;
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  iVar7 = isscalar(ctx,shader_type,RVar1,iVar10);
  if (iVar7 == 0) {
    uVar4 = ctx->source_args[idx].swizzle;
    __s[-8] = 'Z';
    __s[-7] = -0x29;
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    make_GLSL_swizzle_string(rel_offset + 0x18,(ulong)uVar4,writemask,iVar10);
  }
  if (pcVar11 == (char *)0x0) {
    pcVar12 = "Unknown source register type.";
    pcVar11 = __s;
LAB_0011d7b3:
    *(undefined8 *)(pcVar11 + -8) = 0x11d7bd;
    failf(ctx,"%s",pcVar12);
  }
  else {
    *(char **)(__s + -8) = pcStack_48;
    *(char **)(__s + -0x10) = rel_offset + 0x18;
    *(char **)(__s + -0x18) = local_58;
    *(undefined1 **)(__s + -0x20) = local_4c;
    *(char **)(__s + -0x28) = __s_00;
    *(char **)(__s + -0x30) = acStack_98;
    __s[-0x38] = -0x61;
    __s[-0x37] = -0x29;
    __s[-0x36] = '\x11';
    __s[-0x35] = '\0';
    __s[-0x34] = '\0';
    __s[-0x33] = '\0';
    __s[-0x32] = '\0';
    __s[-0x31] = '\0';
    snprintf(buf,0x40,"%s%s%s%s%s%s%s%s%s",local_40,pcVar11,pcVar12);
  }
  return buf;
}

Assistant:

static const char *make_GLSL_srcarg_string(Context *ctx, const size_t idx,
                                           const int writemask, char *buf,
                                           const size_t buflen)
{
    *buf = '\0';

    if (idx >= STATICARRAYLEN(ctx->source_args))
    {
        fail(ctx, "Too many source args");
        return buf;
    } // if

    const SourceArgInfo *arg = &ctx->source_args[idx];

    const char *premod_str = "";
    const char *postmod_str = "";
    switch (arg->src_mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_BIAS:
            premod_str = "(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_SIGN:
            premod_str = "((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_COMPLEMENT:
            premod_str = "(1.0 - ";
            postmod_str = ")";
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_X2:
            premod_str = "(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_DZ:
            fail(ctx, "SRCMOD_DZ unsupported"); return buf; // !!! FIXME
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            fail(ctx, "SRCMOD_DW unsupported"); return buf; // !!! FIXME
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            premod_str = "-abs(";
            postmod_str = ")";
            break;

        case SRCMOD_ABS:
            premod_str = "abs(";
            postmod_str = ")";
            break;

        case SRCMOD_NOT:
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch

    const char *regtype_str = NULL;

    if (!arg->relative)
    {
        regtype_str = get_GLSL_varname_in_buf(ctx, arg->regtype, arg->regnum,
                                              (char *) alloca(64), 64);
    } // if

    const char *rel_lbracket = "";
    char rel_offset[32] = { '\0' };
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        if (arg->regtype == REG_TYPE_INPUT)
            regtype_str=get_GLSL_input_array_varname(ctx,(char*)alloca(64),64);
        else
        {
            assert(arg->regtype == REG_TYPE_CONST);
            const int arrayidx = arg->relative_array->index;
            const int offset = arg->regnum - arrayidx;
            assert(offset >= 0);
            if (arg->relative_array->constant)
            {
                const int arraysize = arg->relative_array->count;
                regtype_str = get_GLSL_const_array_varname_in_buf(ctx,
                                arrayidx, arraysize, (char *) alloca(64), 64);
                if (offset != 0)
                    snprintf(rel_offset, sizeof (rel_offset), "%d + ", offset);
            } // if
            else
            {
                regtype_str = get_GLSL_uniform_array_varname(ctx, arg->regtype,
                                                      (char *) alloca(64), 64);
                if (offset == 0)
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "ARRAYBASE_%d + ", arrayidx);
                } // if
                else
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "(ARRAYBASE_%d + %d) + ", arrayidx, offset);
                } // else
            } // else
        } // else

        rel_lbracket = "[";

        rel_regtype_str = get_GLSL_varname_in_buf(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  (char *) alloca(64), 64);
        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';
        rel_rbracket = "]";
    } // if

    char swiz_str[6] = { '\0' };
    if (!isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum))
    {
        make_GLSL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 arg->swizzle, writemask);
    } // if

    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown source register type.");
        return buf;
    } // if

    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s",
             premod_str, regtype_str, rel_lbracket, rel_offset,
             rel_regtype_str, rel_swizzle, rel_rbracket, swiz_str,
             postmod_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}